

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_assert.hpp
# Opt level: O0

void debug_assert::detail::
     debug_assertion_failed<type_safe::detail::precondition_error_handler,char_const(&)[20]>
               (source_location *loc,char *expression,char (*args) [20])

{
  char (*message) [20];
  char (*args_local) [20];
  char *expression_local;
  source_location *loc_local;
  
  message = const(args);
  default_handler::handle(loc,expression,*message);
  abort();
}

Assistant:

regular_void debug_assertion_failed(const source_location& loc, const char* expression,
                                        Args&&... args)
    {
#if defined(_MSC_VER)
#    pragma warning(push)
#    pragma warning(disable : 4702)
#endif
        return Handler::handle(loc, expression, detail::forward<Args>(args)...), std::abort(),
               regular_void();
#if defined(_MSC_VER)
#    pragma warning(pop)
#endif
    }